

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenscanner.cpp
# Opt level: O0

void __thiscall TokenScanner::setInput(TokenScanner *this,string *str)

{
  istringstream *piVar1;
  string *str_local;
  TokenScanner *this_local;
  
  this->stringInputFlag = true;
  std::__cxx11::string::operator=((string *)&this->buffer,(string *)str);
  piVar1 = (istringstream *)operator_new(0x180);
  std::__cxx11::istringstream::istringstream(piVar1,&this->buffer,8);
  this->isp = (istream *)piVar1;
  this->savedTokens = (StringCell *)0x0;
  return;
}

Assistant:

void TokenScanner::setInput(string str) {
   stringInputFlag = true;
   buffer = str;
   isp = new istringstream(buffer);
   savedTokens = NULL;
}